

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O1

void DivVerifyInt64Uint64_2(void)

{
  return;
}

Assistant:

void DivVerifyInt64Uint64_2()
{
    TestVector< std::uint64_t, std::int64_t, OpType::Div2 > tests;
    TestCase< std::uint64_t, std::int64_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::uint64_t> si(test.x);
         SafeInt<std::uint64_t> si2;

         si2 = test.y / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
         err_msg( "Error in case int64_uint64_3 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}